

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O2

void predict_or_learn<false,true>(cs_active *cs_a,single_learner *base,example *ec)

{
  wclass **ppwVar1;
  unsigned_long *puVar2;
  float fVar3;
  vw *all;
  lq_data *plVar4;
  wclass *pwVar5;
  example *ec_00;
  bool query_this_label;
  lq_data *lqd_1;
  ostream *poVar6;
  lq_data *plVar7;
  size_t sVar8;
  ulong uVar9;
  wclass *__begin2;
  label_t lVar10;
  uint32_t i_1;
  bool *query_needed;
  size_t i;
  ulong uVar11;
  v_array<lq_data> *__range2;
  uint uVar12;
  lq_data *lqd;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float score;
  uint32_t prediction;
  bool temp3;
  ulong local_230;
  v_array<unsigned_int> *local_228;
  example *local_220;
  label_t local_218;
  single_learner *local_210;
  wclass **local_208;
  label_t local_200;
  size_t local_1f8;
  v_array<lq_data> *local_1f0;
  wclass *local_1e8;
  size_t sStack_1e0;
  string local_1d8;
  stringstream filename;
  ostream local_1a8;
  
  local_200 = (label_t)(ec->l).cs.costs._begin;
  local_218 = (label_t)(ec->l).cs.costs._end;
  local_1e8 = (ec->l).cs.costs.end_array;
  sStack_1e0 = (ec->l).cs.costs.erase_count;
  uVar11 = cs_a->all->sd->queries;
  uVar9 = (ulong)cs_a->num_classes;
  local_210 = base;
  if (cs_a->min_labels * uVar9 <= uVar11) {
    std::__cxx11::stringstream::stringstream((stringstream *)&filename);
    poVar6 = std::operator<<(&local_1a8,(string *)&cs_a->all->final_regressor_name);
    poVar6 = std::operator<<(poVar6,".");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,".");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,".");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    all = cs_a->all;
    std::__cxx11::stringbuf::str();
    VW::save_predictor(all,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    poVar6 = std::operator<<(poVar6,"Number of examples with at least one query = ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    cs_a->min_labels = cs_a->min_labels << 1;
    uVar11 = 0;
    while( true ) {
      if ((ulong)((long)(cs_a->examples_by_queries)._end - (long)(cs_a->examples_by_queries)._begin
                 >> 3) <= uVar11) break;
      poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      poVar6 = std::operator<<(poVar6,"examples with ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," labels queried = ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      uVar11 = uVar11 + 1;
    }
    poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    poVar6 = std::operator<<(poVar6,"labels outside of cost range = ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    poVar6 = std::operator<<(poVar6,"average distance to range = ");
    std::ostream::operator<<(poVar6,cs_a->distance_to_range / (float)cs_a->labels_outside_range);
    poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    poVar6 = std::operator<<(poVar6,"average range = ");
    std::ostream::operator<<(poVar6,cs_a->range / (float)cs_a->labels_outside_range);
    poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::stringstream::~stringstream((stringstream *)&filename);
    uVar11 = cs_a->all->sd->queries;
    uVar9 = (ulong)cs_a->num_classes;
  }
  if (uVar11 < uVar9 * cs_a->max_labels) {
    prediction = 1;
    score = 3.4028235e+38;
    (ec->l).cs.costs._begin = (wclass *)0x0;
    (ec->l).simple.initial = 0.0;
    ppwVar1 = &(ec->l).cs.costs.end_array;
    local_228 = (v_array<unsigned_int> *)CONCAT44(local_228._4_4_,(float)cs_a->t);
    fVar14 = (float)cs_a->t + -1.0;
    local_230._0_4_ = (cs_a->cost_max - cs_a->cost_min) * cs_a->c1;
    fVar3 = cs_a->c0;
    fVar13 = 1.0;
    if (1.0 <= fVar14) {
      fVar13 = fVar14;
    }
    local_220 = ec;
    fVar13 = logf(fVar13 * (float)cs_a->num_classes);
    local_208 = ppwVar1;
    if (local_218 == local_200) {
      _filename = 0.0;
      temp3 = false;
      for (uVar12 = 1; uVar12 <= cs_a->num_classes; uVar12 = uVar12 + 1) {
        inner_loop<false,true>
                  (cs_a,local_210,local_220,uVar12,3.4028235e+38,&prediction,&score,
                   (float *)&filename,false,&temp3);
      }
    }
    else {
      fVar14 = cs_a->cost_max - cs_a->cost_min;
      fVar3 = fVar14 * fVar14 * fVar3 * fVar13;
      local_230 = CONCAT44(local_230._4_4_,(float)local_230 / SQRT(local_228._0_4_));
      for (lVar10 = local_200; ec_00 = local_220, lVar10 != local_218;
          lVar10 = (label_t)((long)lVar10 + 0x10)) {
        _filename = 0.0;
        local_1a8._vptr_basic_ostream = (_func_int **)lVar10;
        v_array<lq_data>::push_back(&cs_a->query_data,(lq_data *)&filename);
      }
      plVar4 = (cs_a->query_data)._end;
      fVar13 = 3.4028235e+38;
      for (plVar7 = (cs_a->query_data)._begin; plVar7 != plVar4; plVar7 = plVar7 + 1) {
        local_228 = (v_array<unsigned_int> *)CONCAT44(local_228._4_4_,fVar13);
        find_cost_range(cs_a,local_210,ec_00,plVar7->cl->class_index,fVar3,(float)local_230,
                        &plVar7->min_pred,&plVar7->max_pred,&plVar7->is_range_large);
        fVar13 = plVar7->max_pred;
        if (local_228._0_4_ <= plVar7->max_pred) {
          fVar13 = local_228._0_4_;
        }
      }
      plVar4 = (cs_a->query_data)._end;
      uVar12 = 0;
      for (plVar7 = (cs_a->query_data)._begin; plVar7 != plVar4; plVar7 = plVar7 + 1) {
        fVar14 = plVar7->min_pred;
        plVar7->is_range_overlapped = fVar13 >= fVar14;
        if (fVar13 < fVar14) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)plVar7->is_range_large ^ 1;
        }
        cs_a->overlapped_and_range_small = cs_a->overlapped_and_range_small + uVar11;
        fVar16 = plVar7->cl->x;
        if ((plVar7->max_pred <= fVar16 && fVar16 != plVar7->max_pred) ||
           (fVar16 < plVar7->min_pred)) {
          cs_a->labels_outside_range = cs_a->labels_outside_range + 1;
          fVar16 = plVar7->cl->x;
          fVar15 = fVar16 - plVar7->max_pred;
          fVar16 = plVar7->min_pred - fVar16;
          if (fVar16 <= fVar15) {
            fVar16 = fVar15;
          }
          cs_a->distance_to_range = fVar16 + cs_a->distance_to_range;
          cs_a->range = (plVar7->max_pred - plVar7->min_pred) + cs_a->range;
        }
        uVar12 = uVar12 + (fVar14 <= fVar13);
      }
      local_1f8 = cs_a->all->sd->queries;
      plVar7 = (cs_a->query_data)._end;
      local_228 = (v_array<unsigned_int> *)&ec_00->pred;
      local_230 = (ulong)uVar12;
      local_1f0 = &cs_a->query_data;
      for (query_needed = &((cs_a->query_data)._begin)->query_needed;
          (lq_data *)(query_needed + -10) != plVar7; query_needed = query_needed + 0x18) {
        if (uVar12 < 2) {
          if (cs_a->use_domination == false) {
LAB_001dc4e2:
            query_this_label = query_needed[-2];
          }
          else {
LAB_001dc4c2:
            query_this_label = false;
          }
        }
        else {
          query_this_label = true;
          if ((cs_a->is_baseline == false) &&
             ((cs_a->use_domination != false || (query_needed[-2] == false)))) {
            if (query_needed[-1] == true) goto LAB_001dc4e2;
            goto LAB_001dc4c2;
          }
        }
        pwVar5 = *(wclass **)(query_needed + 6);
        inner_loop<false,true>
                  (cs_a,local_210,ec_00,pwVar5->class_index,pwVar5->x,&prediction,&score,
                   &pwVar5->partial_prediction,query_this_label,query_needed);
        if (*query_needed == true) {
          v_array<unsigned_int>::push_back(local_228,&(*(wclass **)(query_needed + 6))->class_index)
          ;
        }
        if (cs_a->print_debug_stuff == true) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"label=");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(poVar6," x=");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(*(wclass **)(query_needed + 6))->x);
          poVar6 = std::operator<<(poVar6," prediction=");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(poVar6," score=");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,score);
          poVar6 = std::operator<<(poVar6," pp=");
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             (poVar6,(*(wclass **)(query_needed + 6))->partial_prediction);
          poVar6 = std::operator<<(poVar6," ql=");
          poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
          poVar6 = std::operator<<(poVar6," qn=");
          poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
          poVar6 = std::operator<<(poVar6," ro=");
          poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
          poVar6 = std::operator<<(poVar6," rl=");
          poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
          poVar6 = std::operator<<(poVar6," [");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(float *)(query_needed + -6));
          poVar6 = std::operator<<(poVar6,", ");
          poVar6 = (ostream *)
                   std::ostream::operator<<(poVar6,((lq_data *)(query_needed + -10))->max_pred);
          poVar6 = std::operator<<(poVar6,"] vs delta=");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,fVar3);
          poVar6 = std::operator<<(poVar6," n_overlapped=");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(poVar6," is_baseline=");
          poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
          std::endl<char,std::char_traits<char>>(poVar6);
        }
      }
      v_array<lq_data>::delete_v(local_1f0);
      sVar8 = local_1f8;
      if (cs_a->all->sd->queries != local_1f8) {
        cs_a->num_any_queries = cs_a->num_any_queries + 1;
        sVar8 = cs_a->all->sd->queries;
      }
      puVar2 = (cs_a->examples_by_queries)._begin + (sVar8 - local_1f8);
      *puVar2 = *puVar2 + 1;
      ec_00->partial_prediction = score;
      local_220 = ec_00;
    }
    (local_220->pred).multiclass = prediction;
    (local_220->l).multi = local_200;
    (local_220->l).cs.costs._end = (wclass *)local_218;
    *local_208 = local_1e8;
    local_208[1] = (wclass *)sStack_1e0;
  }
  return;
}

Assistant:

void predict_or_learn(cs_active& cs_a, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;

  // cerr << "is_learn=" << is_learn << " ld.costs.size()=" << ld.costs.size() << endl;
  if (cs_a.all->sd->queries >= cs_a.min_labels * cs_a.num_classes)
  {
    // save regressor
    stringstream filename;
    filename << cs_a.all->final_regressor_name << "." << ec.example_counter << "." << cs_a.all->sd->queries << "."
             << cs_a.num_any_queries;
    VW::save_predictor(*(cs_a.all), filename.str());
    cerr << endl << "Number of examples with at least one query = " << cs_a.num_any_queries;
    // Double label query budget
    cs_a.min_labels *= 2;
    for (size_t i = 0; i < cs_a.examples_by_queries.size(); i++)
    {
      cerr << endl << "examples with " << i << " labels queried = " << cs_a.examples_by_queries[i];
    }

    cerr << endl << "labels outside of cost range = " << cs_a.labels_outside_range;
    cerr << endl << "average distance to range = " << cs_a.distance_to_range / ((float)cs_a.labels_outside_range);
    cerr << endl << "average range = " << cs_a.range / ((float)cs_a.labels_outside_range);

    /*
    for (size_t i=0; i<cs_a.all->sd->distance_to_range.size(); i++)
    {  cerr << endl << "label " << i << ", average distance to range = " <<
    cs_a.all->sd->distance_to_range[i]/((float)(cs_a.t-1));
    }*/

    cerr << endl << endl;
  }

  if (cs_a.all->sd->queries >= cs_a.max_labels * cs_a.num_classes)
    return;

  uint32_t prediction = 1;
  float score = FLT_MAX;
  ec.l.simple = {0., 0., 0.};

  float min_max_cost = FLT_MAX;
  float t = (float)cs_a.t;  // ec.example_t;  // current round
  float t_prev = t - 1.f;   // ec.weight; // last round

  float eta = cs_a.c1 * (cs_a.cost_max - cs_a.cost_min) / sqrt(t);  // threshold on cost range
  float delta = cs_a.c0 * log((float)(cs_a.num_classes * max(t_prev, 1.f))) *
      pow(cs_a.cost_max - cs_a.cost_min, 2);  // threshold on empirical loss difference

  if (ld.costs.size() > 0)
  {
    // Create metadata structure
    for (COST_SENSITIVE::wclass& cl : ld.costs)
    {
      lq_data f = {0.0, 0.0, 0, 0, 0, cl};
      cs_a.query_data.push_back(f);
    }
    uint32_t n_overlapped = 0;
    for (lq_data& lqd : cs_a.query_data)
    {
      find_cost_range(cs_a, base, ec, lqd.cl.class_index, delta, eta, lqd.min_pred, lqd.max_pred, lqd.is_range_large);
      min_max_cost = min(min_max_cost, lqd.max_pred);
    }
    for (lq_data& lqd : cs_a.query_data)
    {
      lqd.is_range_overlapped = (lqd.min_pred <= min_max_cost);
      n_overlapped += (uint32_t)(lqd.is_range_overlapped);
      // large_range = large_range || (cl.is_range_overlapped && cl.is_range_large);
      // if(cl.is_range_overlapped && is_learn)
      //{ cout << "label " << cl.class_index << ", min_pred = " << cl.min_pred << ", max_pred = " << cl.max_pred << ",
      // is_range_large = " << cl.is_range_large << ", eta = " << eta << ", min_max_cost = " << min_max_cost << endl;
      //}
      cs_a.overlapped_and_range_small += (size_t)(lqd.is_range_overlapped && !lqd.is_range_large);
      if (lqd.cl.x > lqd.max_pred || lqd.cl.x < lqd.min_pred)
      {
        cs_a.labels_outside_range++;
        // cs_a.all->sd->distance_to_range[cl.class_index-1] += max(cl.x - cl.max_pred, cl.min_pred - cl.x);
        cs_a.distance_to_range += max(lqd.cl.x - lqd.max_pred, lqd.min_pred - lqd.cl.x);
        cs_a.range += lqd.max_pred - lqd.min_pred;
      }
    }

    bool query = (n_overlapped > 1);
    size_t queries = cs_a.all->sd->queries;
    // bool any_query = false;
    for (lq_data& lqd : cs_a.query_data)
    {
      bool query_label = ((query && cs_a.is_baseline) || (!cs_a.use_domination && lqd.is_range_large) ||
          (query && lqd.is_range_overlapped && lqd.is_range_large));
      inner_loop<is_learn, is_simulation>(cs_a, base, ec, lqd.cl.class_index, lqd.cl.x, prediction, score,
          lqd.cl.partial_prediction, query_label, lqd.query_needed);
      if (lqd.query_needed)
        ec.pred.multilabels.label_v.push_back(lqd.cl.class_index);
      if (cs_a.print_debug_stuff)
        cerr << "label=" << lqd.cl.class_index << " x=" << lqd.cl.x << " prediction=" << prediction
             << " score=" << score << " pp=" << lqd.cl.partial_prediction << " ql=" << query_label
             << " qn=" << lqd.query_needed << " ro=" << lqd.is_range_overlapped << " rl=" << lqd.is_range_large << " ["
             << lqd.min_pred << ", " << lqd.max_pred << "] vs delta=" << delta << " n_overlapped=" << n_overlapped
             << " is_baseline=" << cs_a.is_baseline << endl;
    }

    // Need to pop metadata
    cs_a.query_data.delete_v();

    if (cs_a.all->sd->queries - queries > 0)
      cs_a.num_any_queries++;

    cs_a.examples_by_queries[cs_a.all->sd->queries - queries] += 1;
    // if(any_query)
    // cs_a.num_any_queries++;

    ec.partial_prediction = score;
    if (is_learn)
    {
      cs_a.t++;
    }
  }
  else
  {
    float temp = 0.f;
    bool temp2 = false, temp3 = false;
    for (uint32_t i = 1; i <= cs_a.num_classes; i++)
    {
      inner_loop<false, is_simulation>(cs_a, base, ec, i, FLT_MAX, prediction, score, temp, temp2, temp3);
    }
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}